

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O3

htmlEntityDesc * htmlEntityValueLookup(uint value)

{
  uint uVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    uVar1 = *(uint *)((long)&html40EntitiesTable[0].value + lVar2);
    if (value <= uVar1) {
      if (value < uVar1) {
        return (htmlEntityDesc *)0x0;
      }
      return (htmlEntityDesc *)((long)&html40EntitiesTable[0].value + lVar2);
    }
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0x17b8);
  return (htmlEntityDesc *)0x0;
}

Assistant:

const htmlEntityDesc *
htmlEntityValueLookup(unsigned int value) {
    unsigned int i;

    for (i = 0;i < (sizeof(html40EntitiesTable)/
                    sizeof(html40EntitiesTable[0]));i++) {
        if (html40EntitiesTable[i].value >= value) {
	    if (html40EntitiesTable[i].value > value)
		break;
            return((htmlEntityDescPtr) &html40EntitiesTable[i]);
	}
    }
    return(NULL);
}